

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatclient.cpp
# Opt level: O3

void __thiscall ChatClient::onReadyRead(ChatClient *this)

{
  char cVar1;
  QJsonParseError parseError;
  QJsonDocument jsonDoc;
  QByteArray jsonData;
  QDataStream socketStream;
  QJsonObject local_78 [8];
  QJsonDocument local_70 [8];
  QJsonParseError local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  QDataStream local_50 [24];
  undefined4 local_38;
  
  local_68.offset = 0;
  local_68.error = NoError;
  uStack_60 = 0;
  local_58 = 0;
  QDataStream::QDataStream(local_50,(QIODevice *)this->m_clientSocket);
  local_38 = 0x11;
  while( true ) {
    QDataStream::startTransaction();
    operator>>(local_50,(QByteArray *)&local_68);
    cVar1 = QDataStream::commitTransaction();
    if (cVar1 == '\0') break;
    QJsonDocument::fromJson((QByteArray *)local_70,&local_68);
    cVar1 = QJsonDocument::isObject();
    if (cVar1 != '\0') {
      QJsonDocument::object();
      jsonReceived(this,local_78);
      QJsonObject::~QJsonObject(local_78);
    }
    QJsonDocument::~QJsonDocument(local_70);
  }
  QDataStream::~QDataStream(local_50);
  if (local_68 != (QJsonParseError)0x0) {
    LOCK();
    *(int *)local_68 = *(int *)local_68 + -1;
    UNLOCK();
    if (*(int *)local_68 == 0) {
      QArrayData::deallocate((QArrayData *)local_68,1,8);
    }
  }
  return;
}

Assistant:

void ChatClient::jsonReceived(const QJsonObject &docObj)
{
    // actions depend on the type of message
    const QJsonValue typeVal = docObj.value(QLatin1String("type"));
    if (typeVal.isNull() || !typeVal.isString())
        return; // a message with no type was received so we just ignore it
    if (typeVal.toString().compare(QLatin1String("login"), Qt::CaseInsensitive) == 0) { //It's a login message
        if (m_loggedIn)
            return; // if we are already logged in we ignore
        // the success field will contain the result of our attempt to login
        const QJsonValue resultVal = docObj.value(QLatin1String("success"));
        if (resultVal.isNull() || !resultVal.isBool())
            return; // the message had no success field so we ignore
        const bool loginSuccess = resultVal.toBool();
        if (loginSuccess) {
            // we logged in succesfully and we notify it via the loggedIn signal
            emit loggedIn();
            return;
        }
        // the login attempt failed, we extract the reason of the failure from the JSON
        // and notify it via the loginError signal
        const QJsonValue reasonVal = docObj.value(QLatin1String("reason"));
        emit loginError(reasonVal.toString());
    } else if (typeVal.toString().compare(QLatin1String("message"), Qt::CaseInsensitive) == 0) { //It's a chat message
        // we extract the text field containing the chat text
        const QJsonValue textVal = docObj.value(QLatin1String("text"));
        // we extract the sender field containing the username of the sender
        const QJsonValue senderVal = docObj.value(QLatin1String("sender"));
        if (textVal.isNull() || !textVal.isString())
            return; // the text field was invalid so we ignore
        if (senderVal.isNull() || !senderVal.isString())
            return; // the sender field was invalid so we ignore
        // we notify a new message was received via the messageReceived signal
        emit messageReceived(senderVal.toString(), textVal.toString());
    } else if (typeVal.toString().compare(QLatin1String("newuser"), Qt::CaseInsensitive) == 0) { // A user joined the chat
        // we extract the username of the new user
        const QJsonValue usernameVal = docObj.value(QLatin1String("username"));
        if (usernameVal.isNull() || !usernameVal.isString())
            return; // the username was invalid so we ignore
        // we notify of the new user via the userJoined signal
        emit userJoined(usernameVal.toString());
    } else if (typeVal.toString().compare(QLatin1String("userdisconnected"), Qt::CaseInsensitive) == 0) { // A user left the chat
         // we extract the username of the new user
        const QJsonValue usernameVal = docObj.value(QLatin1String("username"));
        if (usernameVal.isNull() || !usernameVal.isString())
            return; // the username was invalid so we ignore
        // we notify of the user disconnection the userLeft signal
        emit userLeft(usernameVal.toString());
    }
}